

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

plutosvg_document_t * plutosvg_document_load_from_file(char *filename,float width,float height)

{
  FILE *__stream;
  size_t __size;
  char *data_00;
  size_t sVar1;
  size_t nread;
  void *data;
  long length;
  FILE *fp;
  float height_local;
  float width_local;
  char *filename_local;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    fseek(__stream,0,2);
    __size = ftell(__stream);
    if (__size == 0xffffffffffffffff) {
      fclose(__stream);
      filename_local = (char *)0x0;
    }
    else {
      data_00 = (char *)malloc(__size);
      if (data_00 == (char *)0x0) {
        fclose(__stream);
        filename_local = (char *)0x0;
      }
      else {
        fseek(__stream,0,0);
        sVar1 = fread(data_00,1,__size,__stream);
        fclose(__stream);
        if (sVar1 == __size) {
          filename_local =
               (char *)plutosvg_document_load_from_data
                                 (data_00,(int)__size,width,height,free,data_00);
        }
        else {
          free(data_00);
          filename_local = (char *)0x0;
        }
      }
    }
  }
  return (plutosvg_document_t *)filename_local;
}

Assistant:

plutosvg_document_t* plutosvg_document_load_from_file(const char* filename, float width, float height)
{
    FILE* fp = fopen(filename, "rb");
    if(fp == NULL) {
        return NULL;
    }

    fseek(fp, 0, SEEK_END);
    long length = ftell(fp);
    if(length == -1L) {
        fclose(fp);
        return NULL;
    }

    void* data = malloc(length);
    if(data == NULL) {
        fclose(fp);
        return NULL;
    }

    fseek(fp, 0, SEEK_SET);
    size_t nread = fread(data, 1, length, fp);
    fclose(fp);

    if(nread != length) {
        free(data);
        return NULL;
    }

    return plutosvg_document_load_from_data(data, length, width, height, free, data);
}